

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

void __thiscall USBControlTransferParser::ParseStandardDescriptor(USBControlTransferParser *this)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  int iVar5;
  USBStructField *descFields;
  unsigned_long_long local_48;
  unsigned_long_long local_40;
  ulong local_38;
  char *local_30;
  undefined2 local_28;
  
  switch(this->mDescType) {
  case DT_DEVICE:
    descFields = DeviceDescriptorFields;
    break;
  case DT_CONFIGURATION:
  case DT_OTHER_SPEED_CONFIGURATION:
    descFields = ConfigurationDescriptorFields;
    break;
  case DT_STRING:
switchD_00135d8a_caseD_3:
    bVar2 = true;
    if (this->mDescType != DT_CDC_CS_INTERFACE) {
      if (this->mDescType == DT_CDC_CS_ENDPOINT) {
        pmVar4 = std::
                 map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                 ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
        if ((*pmVar4 == CC_CommunicationsAndCDCControl) ||
           (pmVar4 = std::
                     map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                     ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber),
           *pmVar4 == CC_CDCData)) goto LAB_00135dfb;
      }
switchD_00135e16_default:
      descFields = (USBStructField *)0x0;
      goto LAB_00135e45;
    }
LAB_00135dfb:
    switch(this->mDescSubtype) {
    case DST_HEADER:
      descFields = CDCHeaderFields;
      break;
    case DST_CALL_MANAGEMENT:
      descFields = CDCCallManagementFields;
      break;
    case DST_ABSTRACT_CONTROL_MANAGEMENT:
      descFields = CDCAbstractControlManagementFields;
      break;
    case DST_DIRECT_LINE_MANAGEMENT:
      descFields = CDCDirectLineManagementFields;
      break;
    case DST_TELEPHONE_RINGER:
      descFields = CDCTelephoneRingerFields;
      break;
    case DST_TELEPHONE_CALL_AND_LINE_STATE:
      descFields = CDCTelephoneCallStateReportingFields;
      break;
    case DST_UNION:
      descFields = CDCUnionFields;
      break;
    case DST_COUNTRY_SELECTION:
      descFields = CDCCountrySelectionFields;
      break;
    case DST_TELEPHONE_OPERATIONAL_MODES:
      descFields = CDCTelephoneOperationalModesFields;
      break;
    case DST_USB_TERMINAL:
      descFields = CDCUSBTerminalFields;
      break;
    case DST_NETWORK_CHANNEL_TERMINAL:
      descFields = CDCNetworkChannelTerminalFields;
      break;
    case DST_PROTOCOL_UNIT:
      descFields = CDCProtocolUnitFields;
      break;
    case DST_EXTENSION_UNIT:
      descFields = CDCExtensionUnitFields;
      break;
    case DST_MULTI_CHANNEL_MANAGEMENT:
      descFields = CDCMultiChannelFields;
      break;
    case DST_CAPI_CONTROL_MANAGEMENT:
      descFields = CDCCAPIControlFields;
      break;
    case DST_ETHERNET_NETWORKING:
      descFields = CDCEthernetNetworkingFields;
      break;
    case DST_ATM_NETWORKING:
      descFields = CDCATMNetworkingFields;
      break;
    default:
      goto switchD_00135e16_default;
    }
    break;
  case DT_INTERFACE:
    descFields = InterfaceDescriptorFields;
    break;
  case DT_ENDPOINT:
    descFields = EndpointDescriptorFields;
    break;
  case DT_DEVICE_QUALIFIER:
    descFields = DeviceQualifierDescriptorFields;
    break;
  default:
    if ((this->mDescType != DT_HID) ||
       (pmVar4 = std::
                 map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                 ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber), *pmVar4 != CC_HID))
    goto switchD_00135d8a_caseD_3;
    descFields = HIDDescriptorFields;
  }
  bVar2 = false;
LAB_00135e45:
  if (!bVar2) {
    ParseStructure(this,descFields);
  }
  iVar3 = this->mDescBytes;
  iVar5 = this->mParsedOffset;
  if ((iVar5 < iVar3) && (this->mPacketOffset < this->mPacketDataBytes)) {
    do {
      Frame::Frame((Frame *)&local_48);
      local_28 = 0xd;
      puVar1 = (this->pPacket->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = this->mPacketOffset;
      local_48 = puVar1[iVar3 * 8 + 0x10];
      local_40 = puVar1[iVar3 * 8 + 0x18];
      local_38 = (ulong)this->mAddress << 0x30 |
                 (ulong)(this->pPacket->mData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar3 + 2] | 0x100000000;
      local_30 = "byte";
      AnalyzerResults::AddFrame((Frame *)this->pResults);
      this->mPacketOffset = this->mPacketOffset + 1;
      this->mParsedOffset = this->mParsedOffset + 1;
      Frame::~Frame((Frame *)&local_48);
      iVar3 = this->mDescBytes;
      iVar5 = this->mParsedOffset;
      if (iVar3 <= iVar5) break;
    } while (this->mPacketOffset < this->mPacketDataBytes);
  }
  if (iVar3 == iVar5) {
    this->mParsedOffset = 0;
    this->mDescType = DT_Undefined;
  }
  return;
}

Assistant:

void USBControlTransferParser::ParseStandardDescriptor()
{
    USBStructField* descFields = NULL;
    if( mDescType == DT_DEVICE )
        descFields = DeviceDescriptorFields;
    else if( mDescType == DT_DEVICE_QUALIFIER )
        descFields = DeviceQualifierDescriptorFields;
    else if( mDescType == DT_CONFIGURATION || mDescType == DT_OTHER_SPEED_CONFIGURATION )
        descFields = ConfigurationDescriptorFields;
    else if( mDescType == DT_INTERFACE )
        descFields = InterfaceDescriptorFields;
    else if( mDescType == DT_ENDPOINT )
        descFields = EndpointDescriptorFields;
    else if( mDescType == DT_HID && mInterfaceClasses[ mInterfaceNumber ] == CC_HID )
        descFields = HIDDescriptorFields;
    else if( mDescType == DT_CDC_CS_INTERFACE ||
             mDescType == DT_CDC_CS_ENDPOINT && ( mInterfaceClasses[ mInterfaceNumber ] == CC_CommunicationsAndCDCControl ||
                                                  mInterfaceClasses[ mInterfaceNumber ] == CC_CDCData ) )
    {
        if( mDescSubtype == DST_HEADER )
            descFields = CDCHeaderFields;
        else if( mDescSubtype == DST_CALL_MANAGEMENT )
            descFields = CDCCallManagementFields;
        else if( mDescSubtype == DST_ABSTRACT_CONTROL_MANAGEMENT )
            descFields = CDCAbstractControlManagementFields;
        else if( mDescSubtype == DST_DIRECT_LINE_MANAGEMENT )
            descFields = CDCDirectLineManagementFields;
        else if( mDescSubtype == DST_TELEPHONE_RINGER )
            descFields = CDCTelephoneRingerFields;
        else if( mDescSubtype == DST_TELEPHONE_CALL_AND_LINE_STATE )
            descFields = CDCTelephoneCallStateReportingFields;
        else if( mDescSubtype == DST_UNION )
            descFields = CDCUnionFields;
        else if( mDescSubtype == DST_COUNTRY_SELECTION )
            descFields = CDCCountrySelectionFields;
        else if( mDescSubtype == DST_TELEPHONE_OPERATIONAL_MODES )
            descFields = CDCTelephoneOperationalModesFields;
        else if( mDescSubtype == DST_USB_TERMINAL )
            descFields = CDCUSBTerminalFields;
        else if( mDescSubtype == DST_NETWORK_CHANNEL_TERMINAL )
            descFields = CDCNetworkChannelTerminalFields;
        else if( mDescSubtype == DST_PROTOCOL_UNIT )
            descFields = CDCProtocolUnitFields;
        else if( mDescSubtype == DST_EXTENSION_UNIT )
            descFields = CDCExtensionUnitFields;
        else if( mDescSubtype == DST_MULTI_CHANNEL_MANAGEMENT )
            descFields = CDCMultiChannelFields;
        else if( mDescSubtype == DST_CAPI_CONTROL_MANAGEMENT )
            descFields = CDCCAPIControlFields;
        else if( mDescSubtype == DST_ETHERNET_NETWORKING )
            descFields = CDCEthernetNetworkingFields;
        else if( mDescSubtype == DST_ATM_NETWORKING )
            descFields = CDCATMNetworkingFields;
    }

    if( descFields )
        ParseStructure( descFields );

    // parse the rest of the descriptor or packet as raw bytes

    while( mDescBytes > mParsedOffset            // more bytes in descriptor?
           && mPacketDataBytes > mPacketOffset ) // more data in packet?
    {
        USBCtrlTransFieldFrame f;
        f.mFlags = FF_None;
        f.mStartingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 2 ) * 8 );
        f.mEndingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 3 ) * 8 );

        f.PackFrame( pPacket->mData[ mPacketOffset + 2 ], 1, mAddress, Fld_None, "byte" );

        pResults->AddFrame( f );

        ++mPacketOffset;
        ++mParsedOffset;
    }

    // reset the parser if we have completeted parsing the descriptor
    if( mDescBytes == mParsedOffset )
    {
        mParsedOffset = 0;
        mDescType = DT_Undefined;
    }
}